

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

UpdateWitnessStackRequestStruct * __thiscall
cfd::js::api::json::UpdateWitnessStackRequest::ConvertToStruct
          (UpdateWitnessStackRequestStruct *__return_storage_ptr__,UpdateWitnessStackRequest *this)

{
  UpdateWitnessStackTxInRequestStruct local_130;
  undefined1 local_19;
  UpdateWitnessStackRequest *local_18;
  UpdateWitnessStackRequest *this_local;
  UpdateWitnessStackRequestStruct *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (UpdateWitnessStackRequest *)__return_storage_ptr__;
  UpdateWitnessStackRequestStruct::UpdateWitnessStackRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->tx_);
  __return_storage_ptr__->is_elements = (bool)(this->is_elements_ & 1);
  UpdateWitnessStackTxInRequest::ConvertToStruct(&local_130,&this->txin_);
  UpdateWitnessStackTxInRequestStruct::operator=(&__return_storage_ptr__->txin,&local_130);
  UpdateWitnessStackTxInRequestStruct::~UpdateWitnessStackTxInRequestStruct(&local_130);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

UpdateWitnessStackRequestStruct UpdateWitnessStackRequest::ConvertToStruct() const {  // NOLINT
  UpdateWitnessStackRequestStruct result;
  result.tx = tx_;
  result.is_elements = is_elements_;
  result.txin = txin_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}